

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deTimer.c
# Opt level: O0

deTimer * deTimer_create(deTimerCallback callback,void *arg)

{
  int iVar1;
  sigval_t local_68;
  sigevent sevp;
  deTimer *timer;
  void *arg_local;
  deTimerCallback callback_local;
  
  sevp._sigev_un._40_8_ = deCalloc(0x20);
  if ((void *)sevp._sigev_un._40_8_ == (void *)0x0) {
    callback_local = (deTimerCallback)0x0;
  }
  else {
    deMemset(&local_68,0,0x40);
    sevp.sigev_value._4_4_ = 2;
    local_68 = (sigval_t)sevp._sigev_un._40_8_;
    sevp._8_8_ = timerCallback;
    iVar1 = timer_create(0,(sigevent *)&local_68,(timer_t *)(sevp._sigev_un._40_8_ + 0x10));
    if (iVar1 == 0) {
      *(deTimerCallback *)sevp._sigev_un._40_8_ = callback;
      *(void **)(sevp._sigev_un._40_8_ + 8) = arg;
      *(undefined4 *)(sevp._sigev_un._40_8_ + 0x18) = 0;
      callback_local = (deTimerCallback)sevp._sigev_un._40_8_;
    }
    else {
      deFree((void *)sevp._sigev_un._40_8_);
      callback_local = (deTimerCallback)0x0;
    }
  }
  return (deTimer *)callback_local;
}

Assistant:

deTimer* deTimer_create (deTimerCallback callback, void* arg)
{
	deTimer*		timer = (deTimer*)deCalloc(sizeof(deTimer));
	struct sigevent	sevp;

	if (!timer)
		return DE_NULL;

	deMemset(&sevp, 0, sizeof(sevp));
	sevp.sigev_notify			= SIGEV_THREAD;
	sevp.sigev_value.sival_ptr	= timer;
	sevp.sigev_notify_function	= timerCallback;

	if (timer_create(CLOCK_REALTIME, &sevp, &timer->timer) != 0)
	{
		deFree(timer);
		return DE_NULL;
	}

	timer->callback		= callback;
	timer->callbackArg	= arg;
	timer->isActive		= DE_FALSE;

	return timer;
}